

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O1

UtxoData * __thiscall
cfd::Psbt::GetUtxoData(UtxoData *__return_storage_ptr__,Psbt *this,uint32_t index,NetType net_type)

{
  Script *this_00;
  Script *pSVar1;
  string *__rhs;
  uint uVar2;
  void *pvVar3;
  pointer pKVar4;
  NetType net_type_00;
  char cVar5;
  bool bVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  AddressType AVar10;
  pointer puVar11;
  long *plVar12;
  undefined8 *puVar13;
  char **ppcVar14;
  KeyData *pKVar15;
  CfdException *pCVar16;
  uint uVar17;
  ulong uVar18;
  size_t sVar19;
  pointer this_01;
  long lVar20;
  undefined1 auVar21 [8];
  long lVar22;
  long lVar23;
  Pubkey *this_02;
  ByteData last_data_1;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> items;
  Script scriptsig;
  DescriptorScriptReference ref;
  ByteData last_data;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_788;
  ByteData local_768;
  Pubkey local_750;
  long local_738;
  string *local_730;
  Pubkey local_728;
  NetType local_70c;
  ByteData local_708;
  ByteData local_6e8;
  ByteData local_6d0;
  undefined1 local_6b8 [8];
  KeyData *pKStack_6b0;
  undefined1 local_6a8 [32];
  pointer local_688;
  pointer local_670;
  pointer local_658;
  TapBranch local_640;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_5c8;
  Script local_5b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_570;
  Pubkey *local_538;
  ByteData local_530;
  ByteData local_518;
  ByteData local_500;
  undefined1 local_4e8 [8];
  KeyData *pKStack_4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8 [52];
  undefined1 local_198 [16];
  KeyData local_188;
  
  (*(this->super_Psbt)._vptr_Psbt[2])(this,(ulong)index,0x2d2,"GetUtxoData");
  pvVar3 = (this->super_Psbt).wally_psbt_pointer_;
  UtxoData::UtxoData(__return_storage_ptr__);
  __return_storage_ptr__->block_height = 0;
  __return_storage_ptr__->address_type = kP2shAddress;
  lVar22 = (ulong)index * 0xd0;
  core::ByteData::ByteData
            ((ByteData *)local_198,(uint8_t *)(*(long *)(*(long *)((long)pvVar3 + 8) + 8) + lVar22),
             0x20);
  core::ByteData256::ByteData256((ByteData256 *)local_6b8,(ByteData *)local_198);
  core::Txid::Txid((Txid *)local_4e8,(ByteData256 *)local_6b8);
  core::Txid::operator=(&__return_storage_ptr__->txid,(Txid *)local_4e8);
  local_4e8 = (undefined1  [8])&PTR__Txid_00735400;
  if (pKStack_4e0 != (KeyData *)0x0) {
    operator_delete(pKStack_4e0);
  }
  if (local_6b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_6b8);
  }
  local_70c = net_type;
  if ((Pubkey *)local_198._0_8_ != (Pubkey *)0x0) {
    operator_delete((void *)local_198._0_8_);
  }
  uVar2 = *(uint *)(*(long *)(*(long *)((long)pvVar3 + 8) + 8) + 0x20 + lVar22);
  __return_storage_ptr__->vout = uVar2;
  lVar22 = *(long *)((long)pvVar3 + 0x10);
  lVar20 = (ulong)index * 0x110;
  local_738 = *(long *)(lVar22 + 8 + lVar20);
  if (local_738 == 0) {
    lVar22 = *(long *)(lVar22 + lVar20);
    if ((lVar22 != 0) && ((ulong)uVar2 < *(ulong *)(lVar22 + 0x28))) {
      lVar22 = *(long *)(lVar22 + 0x20);
      lVar23 = (ulong)uVar2 * 0x70;
      core::Amount::Amount((Amount *)local_4e8,*(int64_t *)(lVar22 + lVar23));
      lVar22 = lVar22 + lVar23;
      (__return_storage_ptr__->amount).ignore_check_ = pKStack_4e0._0_1_;
      (__return_storage_ptr__->amount).amount_ = (int64_t)local_4e8;
      core::ByteData::ByteData
                ((ByteData *)local_6b8,*(uint8_t **)(lVar22 + 8),*(uint32_t *)(lVar22 + 0x10));
      core::Script::Script((Script *)local_4e8,(ByteData *)local_6b8);
      core::Script::operator=(&__return_storage_ptr__->locking_script,(Script *)local_4e8);
      goto LAB_003b2466;
    }
  }
  else {
    core::Amount::Amount((Amount *)local_4e8,**(int64_t **)(lVar22 + 8 + lVar20));
    (__return_storage_ptr__->amount).ignore_check_ = pKStack_4e0._0_1_;
    (__return_storage_ptr__->amount).amount_ = (int64_t)local_4e8;
    lVar22 = *(long *)(*(long *)((long)pvVar3 + 0x10) + 8 + lVar20);
    core::ByteData::ByteData
              ((ByteData *)local_6b8,*(uint8_t **)(lVar22 + 8),*(uint32_t *)(lVar22 + 0x10));
    core::Script::Script((Script *)local_4e8,(ByteData *)local_6b8);
    core::Script::operator=(&__return_storage_ptr__->locking_script,(Script *)local_4e8);
LAB_003b2466:
    core::Script::~Script((Script *)local_4e8);
    if (local_6b8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_6b8);
    }
  }
  this_00 = &__return_storage_ptr__->locking_script;
  bVar6 = core::Script::IsP2shScript(this_00);
  AVar10 = kP2shAddress;
  if (bVar6) {
LAB_003b2576:
    __return_storage_ptr__->address_type = AVar10;
  }
  else {
    bVar6 = core::Script::IsP2pkhScript(this_00);
    AVar10 = kP2pkhAddress;
    if (bVar6) goto LAB_003b2576;
    bVar6 = core::Script::IsP2wpkhScript(this_00);
    AVar10 = kP2wpkhAddress;
    if (bVar6) goto LAB_003b2576;
    bVar6 = core::Script::IsP2wshScript(this_00);
    AVar10 = kP2wshAddress;
    if (bVar6) goto LAB_003b2576;
  }
  local_788.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_start = (KeyData *)0x0;
  local_788.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_finish = (KeyData *)0x0;
  local_788.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar6 = core::Psbt::IsFinalizedInput(&this->super_Psbt,index);
  if (bVar6) {
    if ((local_738 == 0) ||
       (plVar12 = *(long **)(*(long *)((long)pvVar3 + 0x10) + 0x40 + lVar20), plVar12 == (long *)0x0
       )) {
      if (*(long *)(*(long *)((long)pvVar3 + 0x10) + 0x30 + lVar20) != 0) {
        core::ByteData::ByteData
                  ((ByteData *)local_4e8,
                   *(uint8_t **)(*(long *)((long)pvVar3 + 0x10) + 0x30 + lVar20),
                   *(uint32_t *)(*(long *)((long)pvVar3 + 0x10) + 0x38 + lVar20));
        core::Script::Script((Script *)local_6b8,(ByteData *)local_4e8);
        if (local_4e8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_4e8);
        }
        core::Script::GetElementList
                  ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                   &local_750,(Script *)local_6b8);
        iVar9 = (int)((long)local_750.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      CONCAT44(local_750.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,
                               (uint)local_750.data_.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 5) * -0x55555555;
        if (iVar9 != 0) {
          core::ScriptElement::GetBinaryData
                    (&local_768,
                     (ScriptElement *)
                     (CONCAT44(local_750.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,
                               (uint)local_750.data_.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start) +
                     (ulong)(iVar9 - 1) * 0x60));
          bVar7 = core::Pubkey::IsValid(&local_768);
          if (bVar7) {
            local_708.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_708.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_708.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            uVar18 = (long)local_768.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_768.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
            if (uVar18 == 0) {
              puVar11 = (pointer)0x0;
            }
            else {
              if ((long)uVar18 < 0) {
                std::__throw_bad_alloc();
              }
              puVar11 = (pointer)operator_new(uVar18);
            }
            local_708.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = puVar11 + uVar18;
            sVar19 = (long)local_768.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_768.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
            local_708.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = puVar11;
            if (sVar19 != 0) {
              local_708.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = puVar11;
              memmove(puVar11,local_768.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,sVar19);
            }
            local_708.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = puVar11 + sVar19;
            core::Pubkey::Pubkey(&local_728,&local_708);
            local_198._0_8_ = (Pubkey *)(local_198 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"");
            core::ByteData::ByteData(&local_6d0);
            core::KeyData::KeyData((KeyData *)local_4e8,&local_728,(string *)local_198,&local_6d0);
            std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::
            emplace_back<cfd::core::KeyData>(&local_788,(KeyData *)local_4e8);
            core::KeyData::~KeyData((KeyData *)local_4e8);
            if ((ScriptElement *)
                local_6d0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start != (ScriptElement *)0x0) {
              operator_delete(local_6d0.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if ((Pubkey *)local_198._0_8_ != (Pubkey *)(local_198 + 0x10)) {
              operator_delete((void *)local_198._0_8_);
            }
            if (local_728.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_728.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_708.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_708.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
          }
          else {
            core::Script::Script((Script *)local_4e8,&local_768);
            pSVar1 = &__return_storage_ptr__->redeem_script;
            core::Script::operator=(pSVar1,(Script *)local_4e8);
            core::Script::~Script((Script *)local_4e8);
            bVar7 = core::Script::IsP2pkScript(pSVar1);
            if (bVar7) {
              core::Script::GetElementList
                        ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                          *)&local_6d0,pSVar1);
              core::ScriptElement::GetData
                        (&local_518,
                         (ScriptElement *)
                         local_6d0.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start);
              core::Pubkey::Pubkey(&local_728,&local_518);
              local_198._0_8_ = (Pubkey *)(local_198 + 0x10);
              std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"");
              core::ByteData::ByteData(&local_530);
              core::KeyData::KeyData((KeyData *)local_4e8,&local_728,(string *)local_198,&local_530)
              ;
              std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::
              emplace_back<cfd::core::KeyData>(&local_788,(KeyData *)local_4e8);
              core::KeyData::~KeyData((KeyData *)local_4e8);
              if (local_530.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_530.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if ((Pubkey *)local_198._0_8_ != (Pubkey *)(local_198 + 0x10)) {
                operator_delete((void *)local_198._0_8_);
              }
              if (local_728.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_728.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_518.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_518.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
              ~vector((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *
                      )&local_6d0);
            }
          }
          if ((ScriptElement *)
              local_768.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (ScriptElement *)0x0) {
            operator_delete(local_768.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
        }
        std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
                  ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                   &local_750);
        core::Script::~Script((Script *)local_6b8);
      }
    }
    else if ((int)plVar12[1] != 0) {
      lVar22 = (ulong)((int)plVar12[1] - 1) * 0x10;
      core::ByteData::ByteData
                ((ByteData *)local_198,*(uint8_t **)(*plVar12 + lVar22),
                 *(uint32_t *)(*plVar12 + 8 + lVar22));
      bVar7 = core::Pubkey::IsValid((ByteData *)local_198);
      if (bVar7) {
        local_6e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_6e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_6e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar18 = local_198._8_8_ - local_198._0_8_;
        if (uVar18 == 0) {
          puVar11 = (pointer)0x0;
        }
        else {
          if ((long)uVar18 < 0) {
            std::__throw_bad_alloc();
          }
          puVar11 = (pointer)operator_new(uVar18);
        }
        local_6e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = puVar11 + uVar18;
        sVar19 = local_198._8_8_ - local_198._0_8_;
        local_6e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = puVar11;
        if (sVar19 != 0) {
          local_6e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar11;
          memmove(puVar11,(void *)local_198._0_8_,sVar19);
        }
        local_6e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar11 + sVar19;
        core::Pubkey::Pubkey(&local_750,&local_6e8);
        local_6b8 = (undefined1  [8])local_6a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_6b8,"");
        core::ByteData::ByteData(&local_768);
        core::KeyData::KeyData((KeyData *)local_4e8,&local_750,(string *)local_6b8,&local_768);
        std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::
        emplace_back<cfd::core::KeyData>(&local_788,(KeyData *)local_4e8);
        core::KeyData::~KeyData((KeyData *)local_4e8);
        if ((ScriptElement *)
            local_768.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (ScriptElement *)0x0) {
          operator_delete(local_768.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_6b8 != (undefined1  [8])local_6a8) {
          operator_delete((void *)local_6b8);
        }
        if ((void *)CONCAT44(local_750.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                             (uint)local_750.data_.data_.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
          operator_delete((void *)CONCAT44(local_750.data_.data_.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                           (uint)local_750.data_.data_.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start));
        }
        if (local_6e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_6e8.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (__return_storage_ptr__->address_type == kP2shAddress) {
          __return_storage_ptr__->address_type = kP2shP2wpkhAddress;
        }
      }
      else {
        core::Script::Script((Script *)local_4e8,(ByteData *)local_198);
        pSVar1 = &__return_storage_ptr__->redeem_script;
        core::Script::operator=(pSVar1,(Script *)local_4e8);
        core::Script::~Script((Script *)local_4e8);
        if (__return_storage_ptr__->address_type == kP2shAddress) {
          __return_storage_ptr__->address_type = kP2shP2wshAddress;
        }
        bVar7 = core::Script::IsP2pkScript(pSVar1);
        if (bVar7) {
          core::Script::GetElementList
                    ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                     &local_768,pSVar1);
          core::ScriptElement::GetData
                    (&local_500,
                     (ScriptElement *)
                     local_768.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
          core::Pubkey::Pubkey(&local_750,&local_500);
          local_6b8 = (undefined1  [8])local_6a8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_6b8,"");
          core::ByteData::ByteData(&local_728.data_);
          core::KeyData::KeyData
                    ((KeyData *)local_4e8,&local_750,(string *)local_6b8,&local_728.data_);
          std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::
          emplace_back<cfd::core::KeyData>(&local_788,(KeyData *)local_4e8);
          core::KeyData::~KeyData((KeyData *)local_4e8);
          if (local_728.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_728.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_6b8 != (undefined1  [8])local_6a8) {
            operator_delete((void *)local_6b8);
          }
          if ((void *)CONCAT44(local_750.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,
                               (uint)local_750.data_.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
            operator_delete((void *)CONCAT44(local_750.data_.data_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                             (uint)local_750.data_.data_.
                                                                                                      
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start));
          }
          if (local_500.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_500.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
                    ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                     &local_768);
        }
      }
      if ((Pubkey *)local_198._0_8_ != (Pubkey *)0x0) {
        operator_delete((void *)local_198._0_8_);
      }
    }
  }
  else {
    if (local_738 == 0) {
      if (*(long *)(*(long *)((long)pvVar3 + 0x10) + 0x10 + lVar20) != 0) {
        core::ByteData::ByteData
                  ((ByteData *)local_6b8,
                   *(uint8_t **)(*(long *)((long)pvVar3 + 0x10) + 0x10 + lVar20),
                   *(uint32_t *)(*(long *)((long)pvVar3 + 0x10) + 0x18 + lVar20));
        core::Script::Script((Script *)local_4e8,(ByteData *)local_6b8);
        core::Script::operator=(&__return_storage_ptr__->redeem_script,(Script *)local_4e8);
        core::Script::~Script((Script *)local_4e8);
        if (local_6b8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_6b8);
        }
      }
      core::Psbt::GetTxInKeyDataList
                ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_6b8,
                 &this->super_Psbt,index);
    }
    else {
      if (*(long *)(*(long *)((long)pvVar3 + 0x10) + 0x20 + lVar20) == 0) {
        AVar10 = kP2shP2wpkhAddress;
      }
      else {
        core::ByteData::ByteData
                  ((ByteData *)local_6b8,
                   *(uint8_t **)(*(long *)((long)pvVar3 + 0x10) + 0x20 + lVar20),
                   *(uint32_t *)(*(long *)((long)pvVar3 + 0x10) + 0x28 + lVar20));
        core::Script::Script((Script *)local_4e8,(ByteData *)local_6b8);
        core::Script::operator=(&__return_storage_ptr__->redeem_script,(Script *)local_4e8);
        core::Script::~Script((Script *)local_4e8);
        if (local_6b8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_6b8);
        }
        AVar10 = kP2shP2wshAddress;
      }
      if (__return_storage_ptr__->address_type == kP2shAddress) {
        __return_storage_ptr__->address_type = AVar10;
      }
      core::Psbt::GetTxInKeyDataList
                ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_6b8,
                 &this->super_Psbt,index);
    }
    local_4d8[0]._0_8_ =
         local_788.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    pKStack_4e0 = local_788.
                  super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
    local_4e8 = (undefined1  [8])
                local_788.
                super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_788.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_6b8;
    local_788.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
    super__Vector_impl_data._M_finish = pKStack_6b0;
    local_788.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_6a8._0_8_;
    local_6b8 = (undefined1  [8])0x0;
    pKStack_6b0 = (KeyData *)0x0;
    local_6a8._0_8_ = (pointer)0x0;
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_4e8);
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_6b8);
  }
  if ((!bVar6) && (*(long *)(*(long *)((long)pvVar3 + 0x10) + 0x50 + lVar20) == 0))
  goto LAB_003b38cf;
  bVar6 = core::Script::IsP2wpkhScript(this_00);
  if ((bVar6) ||
     ((bVar6 = core::Script::IsP2shScript(this_00), bVar6 &&
      (bVar6 = core::Script::IsEmpty(&__return_storage_ptr__->redeem_script), bVar6)))) {
    if ((long)local_788.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_788.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
              _M_impl.super__Vector_impl_data._M_start != 0x150) {
      local_4e8 = (undefined1  [8])0x5f022d;
      pKStack_4e0 = (KeyData *)CONCAT44(pKStack_4e0._4_4_,0x34a);
      local_4d8[0]._M_allocated_capacity = "GetUtxoData";
      core::logger::log<>((CfdSourceLocation *)local_4e8,kCfdLogLevelWarning,
                          "psbt not supported. many pubkey for p2wpkh.");
      pCVar16 = (CfdException *)__cxa_allocate_exception(0x30);
      local_4e8 = (undefined1  [8])local_4d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4e8,"psbt not supported. many pubkey for p2wpkh.","");
      core::CfdException::CfdException(pCVar16,kCfdIllegalStateError,(string *)local_4e8);
      __cxa_throw(pCVar16,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    core::KeyData::ToString_abi_cxx11_
              ((string *)local_198,
               local_788.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>
               ._M_impl.super__Vector_impl_data._M_start,true,kApostrophe,false);
    plVar12 = (long *)std::__cxx11::string::replace((ulong)local_198,0,(char *)0x0,0x5edc26);
    pKVar15 = (KeyData *)(plVar12 + 2);
    if ((KeyData *)*plVar12 == pKVar15) {
      local_6a8._0_8_ = *(undefined8 *)&pKVar15->pubkey_;
      local_6a8._8_8_ = plVar12[3];
      local_6b8 = (undefined1  [8])local_6a8;
    }
    else {
      local_6a8._0_8_ = *(undefined8 *)&pKVar15->pubkey_;
      local_6b8 = (undefined1  [8])*plVar12;
    }
    pKStack_6b0 = (KeyData *)plVar12[1];
    *plVar12 = (long)pKVar15;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    puVar13 = (undefined8 *)std::__cxx11::string::append(local_6b8);
    pKVar15 = (KeyData *)(puVar13 + 2);
    if ((KeyData *)*puVar13 == pKVar15) {
      local_4d8[0]._0_8_ = *(undefined8 *)&pKVar15->pubkey_;
      local_4d8[0]._8_8_ = puVar13[3];
      local_4e8 = (undefined1  [8])local_4d8;
    }
    else {
      local_4d8[0]._0_8_ = *(undefined8 *)&pKVar15->pubkey_;
      local_4e8 = (undefined1  [8])*puVar13;
    }
    pKStack_4e0 = (KeyData *)puVar13[1];
    *puVar13 = pKVar15;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    __rhs = &__return_storage_ptr__->descriptor;
    std::__cxx11::string::operator=((string *)__rhs,(string *)local_4e8);
    if (local_4e8 != (undefined1  [8])local_4d8) {
      operator_delete((void *)local_4e8);
    }
    if (local_6b8 != (undefined1  [8])local_6a8) {
      operator_delete((void *)local_6b8);
    }
    if ((Pubkey *)local_198._0_8_ != (Pubkey *)(local_198 + 0x10)) {
      operator_delete((void *)local_198._0_8_);
    }
    bVar6 = core::Script::IsP2shScript(this_00);
    if (!bVar6) goto LAB_003b38cf;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6b8,
                   "sh(",__rhs);
    puVar13 = (undefined8 *)std::__cxx11::string::append(local_6b8);
    pKVar15 = (KeyData *)(puVar13 + 2);
    if ((KeyData *)*puVar13 == pKVar15) {
      local_4d8[0]._0_8_ = *(undefined8 *)&pKVar15->pubkey_;
      local_4d8[0]._8_8_ = puVar13[3];
      local_4e8 = (undefined1  [8])local_4d8;
    }
    else {
      local_4d8[0]._0_8_ = *(undefined8 *)&pKVar15->pubkey_;
      local_4e8 = (undefined1  [8])*puVar13;
    }
    pKStack_4e0 = (KeyData *)puVar13[1];
    *puVar13 = pKVar15;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    std::__cxx11::string::operator=((string *)__rhs,(string *)local_4e8);
    if (local_4e8 != (undefined1  [8])local_4d8) {
      operator_delete((void *)local_4e8);
    }
    auVar21 = local_6b8;
    if (local_6b8 == (undefined1  [8])local_6a8) goto LAB_003b38cf;
  }
  else {
    bVar6 = core::Script::IsP2wshScript(this_00);
    if ((bVar6) || (bVar6 = core::Script::IsP2shScript(this_00), bVar6)) {
      pSVar1 = &__return_storage_ptr__->redeem_script;
      bVar6 = core::Script::IsMultisigScript(pSVar1);
      if (bVar6) {
        local_750.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
        core::ScriptUtil::ExtractPubkeysFromMultisigScript
                  ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_198,pSVar1
                   ,(uint32_t *)&local_750);
        uVar2 = (uint)local_750.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        cVar8 = '\x01';
        if (9 < (uint)local_750.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start) {
          uVar17 = (uint)local_750.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
          cVar5 = '\x04';
          do {
            cVar8 = cVar5;
            if (uVar17 < 100) {
              cVar8 = cVar8 + -2;
              goto LAB_003b3339;
            }
            if (uVar17 < 1000) {
              cVar8 = cVar8 + -1;
              goto LAB_003b3339;
            }
            if (uVar17 < 10000) goto LAB_003b3339;
            bVar6 = 99999 < uVar17;
            uVar17 = uVar17 / 10000;
            cVar5 = cVar8 + '\x04';
          } while (bVar6);
          cVar8 = cVar8 + '\x01';
        }
LAB_003b3339:
        local_6b8 = (undefined1  [8])local_6a8;
        std::__cxx11::string::_M_construct((ulong)local_6b8,cVar8);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)local_6b8,(WitnessVersion)pKStack_6b0,uVar2);
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)local_6b8,0,(char *)0x0,0x5f04dc);
        pKVar15 = (KeyData *)(puVar13 + 2);
        if ((KeyData *)*puVar13 == pKVar15) {
          local_4d8[0]._0_8_ = *(undefined8 *)&pKVar15->pubkey_;
          local_4d8[0]._8_8_ = puVar13[3];
          local_4e8 = (undefined1  [8])local_4d8;
        }
        else {
          local_4d8[0]._0_8_ = *(undefined8 *)&pKVar15->pubkey_;
          local_4e8 = (undefined1  [8])*puVar13;
        }
        pKStack_4e0 = (KeyData *)puVar13[1];
        *puVar13 = pKVar15;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        local_730 = &__return_storage_ptr__->descriptor;
        std::__cxx11::string::operator=((string *)local_730,(string *)local_4e8);
        if (local_4e8 != (undefined1  [8])local_4d8) {
          operator_delete((void *)local_4e8);
        }
        if (local_6b8 != (undefined1  [8])local_6a8) {
          operator_delete((void *)local_6b8);
        }
        local_538 = (Pubkey *)local_198._8_8_;
        if (local_198._0_8_ != local_198._8_8_) {
          this_02 = (Pubkey *)local_198._0_8_;
          do {
            pKVar4 = local_788.
                     super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            if (local_788.
                super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_788.
                super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
                super__Vector_impl_data._M_finish) {
LAB_003b3585:
              core::Pubkey::GetHex_abi_cxx11_((string *)local_6b8,this_02);
              puVar13 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)local_6b8,0,(char *)0x0,0x5e7c57);
              pKVar15 = (KeyData *)(puVar13 + 2);
              if ((KeyData *)*puVar13 == pKVar15) {
                local_4d8[0]._0_8_ = *(undefined8 *)&pKVar15->pubkey_;
                local_4d8[0]._8_8_ = puVar13[3];
                local_4e8 = (undefined1  [8])local_4d8;
              }
              else {
                local_4d8[0]._0_8_ = *(undefined8 *)&pKVar15->pubkey_;
                local_4e8 = (undefined1  [8])*puVar13;
              }
              pKStack_4e0 = (KeyData *)puVar13[1];
              *puVar13 = pKVar15;
              puVar13[1] = 0;
              *(undefined1 *)(puVar13 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_730,(ulong)local_4e8);
              if (local_4e8 != (undefined1  [8])local_4d8) {
                operator_delete((void *)local_4e8);
              }
              if (local_6b8 != (undefined1  [8])local_6a8) {
                operator_delete((void *)local_6b8);
              }
            }
            else {
              bVar6 = false;
              this_01 = local_788.
                        super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              do {
                core::KeyData::GetPubkey((Pubkey *)local_4e8,this_01);
                bVar7 = core::Pubkey::Equals(this_02,(Pubkey *)local_4e8);
                if (local_4e8 != (undefined1  [8])0x0) {
                  operator_delete((void *)local_4e8);
                }
                if (bVar7) {
                  core::KeyData::ToString_abi_cxx11_
                            ((string *)local_6b8,this_01,true,kApostrophe,false);
                  puVar13 = (undefined8 *)
                            std::__cxx11::string::replace((ulong)local_6b8,0,(char *)0x0,0x5e7c57);
                  pKVar15 = (KeyData *)(puVar13 + 2);
                  if ((KeyData *)*puVar13 == pKVar15) {
                    local_4d8[0]._0_8_ = *(undefined8 *)&pKVar15->pubkey_;
                    local_4d8[0]._8_8_ = puVar13[3];
                    local_4e8 = (undefined1  [8])local_4d8;
                  }
                  else {
                    local_4d8[0]._0_8_ = *(undefined8 *)&pKVar15->pubkey_;
                    local_4e8 = (undefined1  [8])*puVar13;
                  }
                  pKStack_4e0 = (KeyData *)puVar13[1];
                  *puVar13 = pKVar15;
                  puVar13[1] = 0;
                  *(undefined1 *)(puVar13 + 2) = 0;
                  std::__cxx11::string::_M_append((char *)local_730,(ulong)local_4e8);
                  if (local_4e8 != (undefined1  [8])local_4d8) {
                    operator_delete((void *)local_4e8);
                  }
                  if (local_6b8 != (undefined1  [8])local_6a8) {
                    operator_delete((void *)local_6b8);
                  }
                  bVar6 = true;
                }
                this_01 = this_01 + 1;
              } while (this_01 != pKVar4);
              if (!bVar6) goto LAB_003b3585;
            }
            this_02 = this_02 + 1;
          } while (this_02 != local_538);
        }
        std::__cxx11::string::append((char *)local_730);
        std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
                  ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_198);
      }
      else {
        bVar6 = core::Script::IsP2pkScript(pSVar1);
        if (bVar6) {
          if ((long)local_788.
                    super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_788.
                    super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
                    _M_impl.super__Vector_impl_data._M_start != 0x150) {
            local_4e8 = (undefined1  [8])0x5f022d;
            pKStack_4e0 = (KeyData *)CONCAT44(pKStack_4e0._4_4_,0x36a);
            local_4d8[0]._M_allocated_capacity = "GetUtxoData";
            core::logger::log<>((CfdSourceLocation *)local_4e8,kCfdLogLevelWarning,
                                "psbt not supported. many pubkey for p2pkh.");
            pCVar16 = (CfdException *)__cxa_allocate_exception(0x30);
            local_4e8 = (undefined1  [8])local_4d8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_4e8,"psbt not supported. many pubkey for p2pkh.","");
            core::CfdException::CfdException(pCVar16,kCfdIllegalStateError,(string *)local_4e8);
            __cxa_throw(pCVar16,&core::CfdException::typeinfo,core::CfdException::~CfdException);
          }
          core::KeyData::ToString_abi_cxx11_
                    ((string *)local_198,
                     local_788.
                     super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
                     _M_impl.super__Vector_impl_data._M_start,true,kApostrophe,false);
          puVar13 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_198,0,(char *)0x0,0x5edc27);
          pKVar15 = (KeyData *)(puVar13 + 2);
          if ((KeyData *)*puVar13 == pKVar15) {
            local_6a8._0_8_ = *(undefined8 *)&pKVar15->pubkey_;
            local_6a8._8_8_ = puVar13[3];
            local_6b8 = (undefined1  [8])local_6a8;
          }
          else {
            local_6a8._0_8_ = *(undefined8 *)&pKVar15->pubkey_;
            local_6b8 = (undefined1  [8])*puVar13;
          }
          pKStack_6b0 = (KeyData *)puVar13[1];
          *puVar13 = pKVar15;
          puVar13[1] = 0;
          *(undefined1 *)(puVar13 + 2) = 0;
          puVar13 = (undefined8 *)std::__cxx11::string::append(local_6b8);
          pKVar15 = (KeyData *)(puVar13 + 2);
          if ((KeyData *)*puVar13 == pKVar15) {
            local_4d8[0]._0_8_ = *(undefined8 *)&pKVar15->pubkey_;
            local_4d8[0]._8_8_ = puVar13[3];
            local_4e8 = (undefined1  [8])local_4d8;
          }
          else {
            local_4d8[0]._0_8_ = *(undefined8 *)&pKVar15->pubkey_;
            local_4e8 = (undefined1  [8])*puVar13;
          }
          pKStack_4e0 = (KeyData *)puVar13[1];
          *puVar13 = pKVar15;
          puVar13[1] = 0;
          *(undefined1 *)(puVar13 + 2) = 0;
          std::__cxx11::string::operator=
                    ((string *)&__return_storage_ptr__->descriptor,(string *)local_4e8);
          if (local_4e8 != (undefined1  [8])local_4d8) {
            operator_delete((void *)local_4e8);
          }
          if (local_6b8 != (undefined1  [8])local_6a8) {
            operator_delete((void *)local_6b8);
          }
          ppcVar14 = (char **)(local_198 + 0x10);
        }
        else {
          core::Script::GetHex_abi_cxx11_((string *)local_4e8,pSVar1);
          std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->descriptor);
          ppcVar14 = (char **)local_4d8;
        }
        if ((char **)ppcVar14[-2] != ppcVar14) {
          operator_delete(ppcVar14[-2]);
        }
      }
      if (local_738 != 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_6b8,"wsh(",&__return_storage_ptr__->descriptor);
        puVar13 = (undefined8 *)std::__cxx11::string::append(local_6b8);
        pKVar15 = (KeyData *)(puVar13 + 2);
        if ((KeyData *)*puVar13 == pKVar15) {
          local_4d8[0]._0_8_ = *(undefined8 *)&pKVar15->pubkey_;
          local_4d8[0]._8_8_ = puVar13[3];
          local_4e8 = (undefined1  [8])local_4d8;
        }
        else {
          local_4d8[0]._0_8_ = *(undefined8 *)&pKVar15->pubkey_;
          local_4e8 = (undefined1  [8])*puVar13;
        }
        pKStack_4e0 = (KeyData *)puVar13[1];
        *puVar13 = pKVar15;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        std::__cxx11::string::operator=
                  ((string *)&__return_storage_ptr__->descriptor,(string *)local_4e8);
        if (local_4e8 != (undefined1  [8])local_4d8) {
          operator_delete((void *)local_4e8);
        }
        if (local_6b8 != (undefined1  [8])local_6a8) {
          operator_delete((void *)local_6b8);
        }
      }
      bVar6 = core::Script::IsP2shScript(this_00);
      if (!bVar6) goto LAB_003b38cf;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6b8,
                     "sh(",&__return_storage_ptr__->descriptor);
      puVar13 = (undefined8 *)std::__cxx11::string::append(local_6b8);
      pKVar15 = (KeyData *)(puVar13 + 2);
      if ((KeyData *)*puVar13 == pKVar15) {
        local_4d8[0]._0_8_ = *(undefined8 *)&pKVar15->pubkey_;
        local_4d8[0]._8_8_ = puVar13[3];
        local_4e8 = (undefined1  [8])local_4d8;
      }
      else {
        local_4d8[0]._0_8_ = *(undefined8 *)&pKVar15->pubkey_;
        local_4e8 = (undefined1  [8])*puVar13;
      }
      pKStack_4e0 = (KeyData *)puVar13[1];
      *puVar13 = pKVar15;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->descriptor,(string *)local_4e8);
      if (local_4e8 != (undefined1  [8])local_4d8) {
        operator_delete((void *)local_4e8);
      }
      pKVar15 = (KeyData *)local_6a8;
    }
    else {
      bVar6 = core::Script::IsP2pkhScript(this_00);
      if (!bVar6) goto LAB_003b38cf;
      if ((long)local_788.
                super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_788.
                super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
                super__Vector_impl_data._M_start != 0x150) {
        local_4e8 = (undefined1  [8])0x5f022d;
        pKStack_4e0 = (KeyData *)CONCAT44(pKStack_4e0._4_4_,0x37c);
        local_4d8[0]._M_allocated_capacity = "GetUtxoData";
        core::logger::log<>((CfdSourceLocation *)local_4e8,kCfdLogLevelWarning,
                            "psbt not supported. many pubkey for p2pkh.");
        pCVar16 = (CfdException *)__cxa_allocate_exception(0x30);
        local_4e8 = (undefined1  [8])local_4d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_4e8,"psbt not supported. many pubkey for p2pkh.","");
        core::CfdException::CfdException(pCVar16,kCfdIllegalStateError,(string *)local_4e8);
        __cxa_throw(pCVar16,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      core::KeyData::ToString_abi_cxx11_
                ((string *)local_198,
                 local_788.
                 super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl
                 .super__Vector_impl_data._M_start,true,kApostrophe,false);
      puVar13 = (undefined8 *)std::__cxx11::string::replace((ulong)local_198,0,(char *)0x0,0x5edc27)
      ;
      pKVar15 = (KeyData *)(puVar13 + 2);
      if ((KeyData *)*puVar13 == pKVar15) {
        local_6a8._0_8_ = *(undefined8 *)&pKVar15->pubkey_;
        local_6a8._8_8_ = puVar13[3];
        local_6b8 = (undefined1  [8])local_6a8;
      }
      else {
        local_6a8._0_8_ = *(undefined8 *)&pKVar15->pubkey_;
        local_6b8 = (undefined1  [8])*puVar13;
      }
      pKStack_6b0 = (KeyData *)puVar13[1];
      *puVar13 = pKVar15;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      puVar13 = (undefined8 *)std::__cxx11::string::append(local_6b8);
      pKVar15 = (KeyData *)(puVar13 + 2);
      if ((KeyData *)*puVar13 == pKVar15) {
        local_4d8[0]._0_8_ = *(undefined8 *)&pKVar15->pubkey_;
        local_4d8[0]._8_8_ = puVar13[3];
        local_4e8 = (undefined1  [8])local_4d8;
      }
      else {
        local_4d8[0]._0_8_ = *(undefined8 *)&pKVar15->pubkey_;
        local_4e8 = (undefined1  [8])*puVar13;
      }
      pKStack_4e0 = (KeyData *)puVar13[1];
      *puVar13 = pKVar15;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->descriptor,(string *)local_4e8);
      if (local_4e8 != (undefined1  [8])local_4d8) {
        operator_delete((void *)local_4e8);
      }
      if (local_6b8 != (undefined1  [8])local_6a8) {
        operator_delete((void *)local_6b8);
      }
      pKVar15 = (KeyData *)(local_198 + 0x10);
    }
    auVar21 = (undefined1  [8])
              pKVar15[0xffffffffffffffff].fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (auVar21 == (undefined1  [8])pKVar15) goto LAB_003b38cf;
  }
  operator_delete((void *)auVar21);
LAB_003b38cf:
  if ((__return_storage_ptr__->descriptor)._M_string_length != 0) {
    core::Descriptor::Parse
              ((Descriptor *)local_198,&__return_storage_ptr__->descriptor,
               (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                *)0x0);
    core::Descriptor::GetReference
              ((DescriptorScriptReference *)local_4e8,(Descriptor *)local_198,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0);
    net_type_00 = local_70c;
    core::DescriptorScriptReference::GetLockingScript
              ((Script *)local_6b8,(DescriptorScriptReference *)local_4e8);
    bVar6 = core::Script::Equals((Script *)local_6b8,this_00);
    core::Script::~Script((Script *)local_6b8);
    if (!bVar6) {
      local_6b8 = (undefined1  [8])0x5f022d;
      pKStack_6b0 = (KeyData *)CONCAT44(pKStack_6b0._4_4_,0x38b);
      local_6a8._0_8_ = "GetUtxoData";
      core::logger::log<>((CfdSourceLocation *)local_6b8,kCfdLogLevelWarning,
                          "psbt invalid state. unmatch descriptor & lockingScript.");
      pCVar16 = (CfdException *)__cxa_allocate_exception(0x30);
      local_6b8 = (undefined1  [8])local_6a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6b8,"psbt invalid state. unmatch descriptor & lockingScript.","");
      core::CfdException::CfdException(pCVar16,kCfdIllegalStateError,(string *)local_6b8);
      __cxa_throw(pCVar16,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    core::DescriptorScriptReference::GenerateAddress
              ((Address *)local_6b8,(DescriptorScriptReference *)local_4e8,net_type_00);
    core::Address::operator=(&__return_storage_ptr__->address,(Address *)local_6b8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_570);
    core::Script::~Script(&local_5b0);
    local_640._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_5c8);
    core::TapBranch::~TapBranch(&local_640);
    if (local_658 != (pointer)0x0) {
      operator_delete(local_658);
    }
    if (local_670 != (pointer)0x0) {
      operator_delete(local_670);
    }
    if (local_688 != (pointer)0x0) {
      operator_delete(local_688);
    }
    if ((pointer)local_6a8._0_8_ != (pointer)(local_6a8 + 0x10)) {
      operator_delete((void *)local_6a8._0_8_);
    }
    AVar10 = core::DescriptorScriptReference::GetAddressType((DescriptorScriptReference *)local_4e8)
    ;
    __return_storage_ptr__->address_type = AVar10;
    core::DescriptorScriptReference::~DescriptorScriptReference
              ((DescriptorScriptReference *)local_4e8);
    core::DescriptorNode::~DescriptorNode((DescriptorNode *)local_198);
  }
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&local_788);
  return __return_storage_ptr__;
}

Assistant:

UtxoData Psbt::GetUtxoData(uint32_t index, NetType net_type) const {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt* psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt*>(wally_psbt_pointer_);
  UtxoData utxo;
  utxo.block_height = 0;
  utxo.address_type = AddressType::kP2shAddress;

  utxo.txid = Txid(ByteData256(ByteData(
      psbt_pointer->tx->inputs[index].txhash,
      sizeof(psbt_pointer->tx->inputs[index].txhash))));
  utxo.vout = psbt_pointer->tx->inputs[index].index;

  bool witness_only = false;
  if (psbt_pointer->inputs[index].witness_utxo != nullptr) {
    utxo.amount = Amount(static_cast<int64_t>(
        psbt_pointer->inputs[index].witness_utxo->satoshi));
    utxo.locking_script = Script(ByteData(
        psbt_pointer->inputs[index].witness_utxo->script,
        static_cast<uint32_t>(
            psbt_pointer->inputs[index].witness_utxo->script_len)));
    witness_only = true;
  } else if (psbt_pointer->inputs[index].utxo != nullptr) {
    if (psbt_pointer->inputs[index].utxo->num_outputs > utxo.vout) {
      auto output = &psbt_pointer->inputs[index].utxo->outputs[utxo.vout];
      utxo.amount = Amount(static_cast<int64_t>(output->satoshi));
      utxo.locking_script = Script(
          ByteData(output->script, static_cast<uint32_t>(output->script_len)));
    }
  }
  if (utxo.locking_script.IsP2shScript()) {
    utxo.address_type = AddressType::kP2shAddress;
  } else if (utxo.locking_script.IsP2pkhScript()) {
    utxo.address_type = AddressType::kP2pkhAddress;
  } else if (utxo.locking_script.IsP2wpkhScript()) {
    utxo.address_type = AddressType::kP2wpkhAddress;
  } else if (utxo.locking_script.IsP2wshScript()) {
    utxo.address_type = AddressType::kP2wshAddress;
  }

  std::vector<KeyData> key_list;
  bool is_finalized = IsFinalizedInput(index);
  if (is_finalized) {
    if (witness_only &&
        (psbt_pointer->inputs[index].final_witness != nullptr)) {
      auto witness_stack = psbt_pointer->inputs[index].final_witness;
      uint32_t last_index = static_cast<uint32_t>(witness_stack->num_items);
      if (last_index > 0) {
        ByteData last_data(
            witness_stack->items[last_index - 1].witness,
            static_cast<uint32_t>(
                witness_stack->items[last_index - 1].witness_len));
        if (Pubkey::IsValid(last_data)) {
          key_list.emplace_back(KeyData(Pubkey(last_data), "", ByteData()));
          if (utxo.address_type == AddressType::kP2shAddress) {
            utxo.address_type = AddressType::kP2shP2wpkhAddress;
          }
        } else {
          utxo.redeem_script = Script(last_data);
          if (utxo.address_type == AddressType::kP2shAddress) {
            utxo.address_type = AddressType::kP2shP2wshAddress;
          }
          if (utxo.redeem_script.IsP2pkScript()) {
            key_list.emplace_back(KeyData(
                Pubkey(utxo.redeem_script.GetElementList()[0].GetData()), "",
                ByteData()));
          }
        }
      }
    } else if (psbt_pointer->inputs[index].final_scriptsig != nullptr) {
      Script scriptsig(ByteData(
          psbt_pointer->inputs[index].final_scriptsig,
          static_cast<uint32_t>(
              psbt_pointer->inputs[index].final_scriptsig_len)));
      auto items = scriptsig.GetElementList();
      uint32_t last_index = static_cast<uint32_t>(items.size());
      if (last_index > 0) {
        ByteData last_data = items[last_index - 1].GetBinaryData();
        if (Pubkey::IsValid(last_data)) {
          key_list.emplace_back(KeyData(Pubkey(last_data), "", ByteData()));
        } else {
          utxo.redeem_script = Script(last_data);
          if (utxo.redeem_script.IsP2pkScript()) {
            key_list.emplace_back(KeyData(
                Pubkey(utxo.redeem_script.GetElementList()[0].GetData()), "",
                ByteData()));
          }
        }
      }
    }
  } else if (witness_only) {
    if (psbt_pointer->inputs[index].witness_script != nullptr) {
      utxo.redeem_script = Script(ByteData(
          psbt_pointer->inputs[index].witness_script,
          static_cast<uint32_t>(
              psbt_pointer->inputs[index].witness_script_len)));
      if (utxo.address_type == AddressType::kP2shAddress) {
        utxo.address_type = AddressType::kP2shP2wshAddress;
      }
    } else if (utxo.address_type == AddressType::kP2shAddress) {
      utxo.address_type = AddressType::kP2shP2wpkhAddress;
    }

    key_list = cfd::core::Psbt::GetTxInKeyDataList(index);
  } else {
    if (psbt_pointer->inputs[index].redeem_script != nullptr) {
      utxo.redeem_script = Script(ByteData(
          psbt_pointer->inputs[index].redeem_script,
          static_cast<uint32_t>(
              psbt_pointer->inputs[index].redeem_script_len)));
    }
    key_list = cfd::core::Psbt::GetTxInKeyDataList(index);
  }

  if ((!is_finalized) &&
      (psbt_pointer->inputs[index].keypaths.num_items == 0)) {
    // unset descriptor
  } else if (
      utxo.locking_script.IsP2wpkhScript() ||
      (utxo.locking_script.IsP2shScript() && utxo.redeem_script.IsEmpty())) {
    if (key_list.size() != 1) {
      warn(CFD_LOG_SOURCE, "psbt not supported. many pubkey for p2wpkh.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "psbt not supported. many pubkey for p2wpkh.");
    }
    utxo.descriptor = "wpkh(" + key_list[0].ToString() + ")";
    if (utxo.locking_script.IsP2shScript()) {
      utxo.descriptor = "sh(" + utxo.descriptor + ")";
    }
  } else if (
      utxo.locking_script.IsP2wshScript() ||
      utxo.locking_script.IsP2shScript()) {
    if (utxo.redeem_script.IsMultisigScript()) {
      uint32_t req_num = 0;
      auto multisig_key_list = ScriptUtil::ExtractPubkeysFromMultisigScript(
          utxo.redeem_script, &req_num);
      utxo.descriptor = "multi(" + std::to_string(req_num);
      for (const auto& pubkey : multisig_key_list) {
        bool is_find = false;
        for (const auto& key : key_list) {
          if (pubkey.Equals(key.GetPubkey())) {
            utxo.descriptor += "," + key.ToString();
            is_find = true;
          }
        }
        if (!is_find) {
          utxo.descriptor += "," + pubkey.GetHex();
        }
      }
      utxo.descriptor += ")";
    } else if (utxo.redeem_script.IsP2pkScript()) {
      if (key_list.size() != 1) {
        warn(CFD_LOG_SOURCE, "psbt not supported. many pubkey for p2pkh.");
        throw CfdException(
            CfdError::kCfdIllegalStateError,
            "psbt not supported. many pubkey for p2pkh.");
      }
      utxo.descriptor = "pkh(" + key_list[0].ToString() + ")";
    } else {
      // not key support
      utxo.descriptor = utxo.redeem_script.GetHex();
    }
    if (witness_only) {
      utxo.descriptor = "wsh(" + utxo.descriptor + ")";
    }
    if (utxo.locking_script.IsP2shScript()) {
      utxo.descriptor = "sh(" + utxo.descriptor + ")";
    }
  } else if (utxo.locking_script.IsP2pkhScript()) {
    if (key_list.size() != 1) {
      warn(CFD_LOG_SOURCE, "psbt not supported. many pubkey for p2pkh.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "psbt not supported. many pubkey for p2pkh.");
    }
    utxo.descriptor = "pkh(" + key_list[0].ToString() + ")";
  } else {
    // unsupported format
  }

  if (!utxo.descriptor.empty()) {
    Descriptor desc = Descriptor::Parse(utxo.descriptor);
    auto ref = desc.GetReference();
    if (!ref.GetLockingScript().Equals(utxo.locking_script)) {
      warn(
          CFD_LOG_SOURCE,
          "psbt invalid state. unmatch descriptor & lockingScript.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "psbt invalid state. unmatch descriptor & lockingScript.");
    }
    utxo.address = ref.GenerateAddress(net_type);
    utxo.address_type = ref.GetAddressType();
  }

  return utxo;
}